

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O1

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  If_Cut_t *pCut;
  byte bVar1;
  If_Obj_t *pIVar2;
  Vec_Mem_t *pVVar3;
  If_Par_t *pIVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  word *pwVar12;
  int *pArrTimeProfile;
  DdNode *n;
  uint *puTruth;
  char *pcVar13;
  Hop_Obj_t *pHVar14;
  word *pwVar15;
  long lVar16;
  ulong uVar17;
  Vec_Ptr_t *pVVar18;
  uint iVar;
  DdManager *dd;
  Hop_Man_t *pHVar19;
  ulong uVar20;
  Abc_Obj_t *pFanins [15];
  Abc_Obj_t *local_a8 [15];
  
  if ((Abc_Obj_t *)(pIfObj->field_22).pCopy != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pIfObj->field_22).pCopy;
  }
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("pIfObj->Type == IF_AND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x1be,
                  "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)")
    ;
  }
  pCut = &pIfObj->CutBest;
  if (pIfMan->pPars->fUserSesLib != 0) {
    uVar9 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    uVar17 = (ulong)(uVar9 >> 0x18);
    if (0xffffff < uVar9) {
      uVar20 = 0;
      do {
        iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar20 * 4);
        if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) goto LAB_002d47ff;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar8];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar10 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        local_a8[uVar20] = pAVar10;
        uVar20 = uVar20 + 1;
        uVar17 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
      } while (uVar20 < uVar17);
    }
    uVar9 = (pIfObj->CutBest).iCutFunc;
    if (-1 < (int)uVar9) {
      pwVar15 = pIfMan->puTempW;
      pVVar3 = pIfMan->vTtMem[uVar17];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar12 = (word *)0x0;
      }
      else {
        uVar7 = uVar9 >> 1;
        if (pVVar3->nEntries <= (int)uVar7) goto LAB_002d485c;
        pwVar12 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar7 = pIfMan->nTruth6Words[uVar17];
      if ((uVar9 & 1) == 0) {
        if (0 < (int)uVar7) {
          uVar17 = 0;
          do {
            pwVar15[uVar17] = pwVar12[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
      }
      else if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = ~pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
      bVar1 = (pIfObj->CutBest).field_0x1f;
      pArrTimeProfile = If_CutArrTimeProfile(pIfMan,pCut);
      pAVar10 = Abc_ExactBuildNode(pwVar15,(uint)bVar1,pArrTimeProfile,local_a8,pNtkNew);
      (pIfObj->field_22).pCopy = pAVar10;
      return pAVar10;
    }
LAB_002d483d:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pAVar10 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pIVar4 = pIfMan->pPars;
  if ((((pIVar4->fDelayOpt == 0) && (pIVar4->fDelayOptLut == 0)) && (pIVar4->fDsdBalance == 0)) &&
     (((pIVar4->fUseTtPerm == 0 && (pIVar4->pLutStruct == (char *)0x0)) &&
      ((pIVar4->fUserRecLib == 0 && ((pIVar4->fUserSesLib == 0 && (pIVar4->nGateSize == 0)))))))) {
    If_CutRotatePins(pIfMan,pCut);
  }
  if ((pIfMan->pPars->fUseCnfs == 0) && (pIfMan->pPars->fUseMv == 0)) {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      uVar17 = 0;
      do {
        iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
        if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) goto LAB_002d47ff;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar8];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar11 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pAVar10,pAVar11);
        uVar17 = uVar17 + 1;
      } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    }
  }
  else {
    uVar9 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    if (0xffffff < uVar9) {
      uVar17 = (ulong)(uVar9 >> 0x18);
      do {
        iVar8 = *(int *)(&(pIfObj->CutBest).field_0x1c + uVar17 * 4);
        if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) goto LAB_002d47ff;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar8];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar11 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pAVar10,pAVar11);
        bVar6 = 1 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar6);
    }
  }
  iVar8 = Abc_ObjLevelNew(pAVar10);
  *(uint *)&pAVar10->field_0x14 = *(uint *)&pAVar10->field_0x14 & 0xfff | iVar8 << 0xc;
  pIVar4 = pIfMan->pPars;
  if (pIVar4->fTruth == 0) {
    if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
      __assert_fail("pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x286,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
    }
    pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
    uVar17 = 0;
    do {
      iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
      if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) goto LAB_002d47ff;
      pvVar5 = pIfMan->vObjs->pArray[iVar8];
      if (pvVar5 == (void *)0x0) break;
      pHVar14 = Hop_IthVar(pHVar19,(int)uVar17);
      *(Hop_Obj_t **)((long)pvVar5 + 0x50) = pHVar14;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    pVVar18 = pIfMan->vTemp;
    pVVar18->nSize = 0;
    pHVar14 = Abc_NodeIfToHop2_rec(pHVar19,pIfMan,pIfObj,pVVar18);
    if (pHVar14 == (Hop_Obj_t *)0x1) {
      puts("Abc_NodeIfToHop(): Computing local AIG has failed.");
      pHVar14 = (Hop_Obj_t *)0x0;
    }
    else {
      if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
        uVar17 = 0;
        do {
          iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
          if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) {
LAB_002d47ff:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar5 = pIfMan->vObjs->pArray[iVar8];
          if (pvVar5 == (void *)0x0) break;
          *(undefined8 *)((long)pvVar5 + 0x50) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
      }
      pVVar18 = pIfMan->vTemp;
      if (0 < pVVar18->nSize) {
        lVar16 = 0;
        do {
          *(undefined8 *)pVVar18->pArray[lVar16] = 0;
          lVar16 = lVar16 + 1;
          pVVar18 = pIfMan->vTemp;
        } while (lVar16 < pVVar18->nSize);
      }
    }
    (pAVar10->field_5).pData = pHVar14;
    goto LAB_002d4646;
  }
  if (pIVar4->fUseBdds == 0) {
    if ((pIVar4->fUseCnfs != 0) || (pIVar4->fUseMv != 0)) {
      uVar9 = (pIfObj->CutBest).iCutFunc;
      if ((int)uVar9 < 0) goto LAB_002d483d;
      dd = (DdManager *)pNtkNew->pManFunc;
      pwVar15 = pIfMan->puTempW;
      bVar1 = (pIfObj->CutBest).field_0x1f;
      pVVar3 = pIfMan->vTtMem[bVar1];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar12 = (word *)0x0;
      }
      else {
        uVar7 = uVar9 >> 1;
        if (pVVar3->nEntries <= (int)uVar7) goto LAB_002d485c;
        pwVar12 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar7 = pIfMan->nTruth6Words[bVar1];
      if ((uVar9 & 1) == 0) {
        if (0 < (int)uVar7) {
          uVar17 = 0;
          do {
            pwVar15[uVar17] = pwVar12[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
      }
      else if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = ~pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
      bVar1 = (pIfObj->CutBest).field_0x1f;
      iVar8 = 1;
      goto LAB_002d4617;
    }
    if ((pIVar4->fUseSops == 0) && (pIVar4->nGateSize < 1)) {
      if (pIVar4->fDelayOpt == 0) {
        if (pIVar4->fDsdBalance != 0) {
          pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
          iVar8 = 1;
          goto LAB_002d4751;
        }
        if (pIVar4->fUserRecLib == 0) {
          pwVar15 = If_CutTruthW(pIfMan,pCut);
          if ((pIfMan->pPars->fUseTtPerm != 0) &&
             (uVar9 = *(uint *)&(pIfObj->CutBest).field_0x1c, 0xffffff < uVar9)) {
            uVar7 = uVar9 >> 0x18;
            iVar = 0;
            do {
              if (((uint)(pIfObj->CutBest).uMaskFunc >> (iVar & 0x1f) & 1) != 0) {
                iVar8 = 1 << ((char)uVar7 - 6U & 0x1f);
                if (uVar9 < 0x7000000) {
                  iVar8 = 1;
                }
                Abc_TtFlip(pwVar15,iVar8,iVar);
              }
              iVar = iVar + 1;
              uVar9 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              uVar7 = uVar9 >> 0x18;
            } while (iVar < uVar7);
          }
          pHVar14 = Kit_TruthToHop((Hop_Man_t *)pNtkNew->pManFunc,(uint *)pwVar15,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        }
        else {
          pHVar14 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
        }
      }
      else {
        pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
        iVar8 = 0;
LAB_002d4751:
        pHVar14 = Abc_NodeBuildFromMini(pHVar19,pIfMan,pCut,iVar8);
      }
      (pAVar10->field_5).pData = pHVar14;
    }
    else {
      puTruth = If_CutTruth(pIfMan,pCut);
      uVar9 = Kit_TruthIsop(puTruth,(uint)(byte)(pIfObj->CutBest).field_0x1f,vCover,1);
      if (1 < uVar9) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                      ,0x1f2,
                      "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((vCover->nSize == 0) || ((vCover->nSize == 1 && (*vCover->pArray == 0)))) {
        if (uVar9 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                        ,0x1f6,
                        "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                       );
        }
        pcVar13 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,(int *)0x0);
        (pAVar10->field_5).pData = pcVar13;
        if (vCover->nSize == 0) {
          pAVar10 = Abc_NtkCreateNodeConst0(pNtkNew);
        }
        else {
          pAVar10 = Abc_NtkCreateNodeConst1(pNtkNew);
        }
      }
      else {
        pcVar13 = Abc_SopCreateFromIsop
                            ((Mem_Flex_t *)pNtkNew->pManFunc,
                             (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        (pAVar10->field_5).pData = pcVar13;
        if (uVar9 != 0) {
          Abc_SopComplement(pcVar13);
        }
      }
    }
  }
  else {
    uVar9 = (pIfObj->CutBest).iCutFunc;
    if ((int)uVar9 < 0) goto LAB_002d483d;
    dd = (DdManager *)pNtkNew->pManFunc;
    pwVar15 = pIfMan->puTempW;
    bVar1 = (pIfObj->CutBest).field_0x1f;
    pVVar3 = pIfMan->vTtMem[bVar1];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar12 = (word *)0x0;
    }
    else {
      uVar7 = uVar9 >> 1;
      if (pVVar3->nEntries <= (int)uVar7) {
LAB_002d485c:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar12 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar7 = pIfMan->nTruth6Words[bVar1];
    if ((uVar9 & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
    }
    else if (0 < (int)uVar7) {
      uVar17 = 0;
      do {
        pwVar15[uVar17] = ~pwVar12[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar7 != uVar17);
    }
    bVar1 = (pIfObj->CutBest).field_0x1f;
    iVar8 = 0;
LAB_002d4617:
    n = Kit_TruthToBdd(dd,(uint *)pwVar15,(uint)bVar1,iVar8);
    (pAVar10->field_5).pData = n;
    Cudd_Ref(n);
  }
  if (((((pIfObj->CutBest).field_0x1d & 0x10) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
     (pIfMan->pPars->fDsdBalance == 0)) {
    Abc_NodeComplement(pAVar10);
  }
LAB_002d4646:
  (pIfObj->field_22).pCopy = pAVar10;
  return pAVar10;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    pCutBest = If_ObjCutBest( pIfObj );
    if ( pIfMan->pPars->fUserSesLib )
    {
        // create the subgraph composed of Abc_Obj_t nodes based on the given cut
        Abc_Obj_t * pFanins[IF_MAX_FUNC_LUTSIZE];
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            pFanins[i] = Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover);
        pNodeNew = Abc_ExactBuildNode( If_CutTruthW(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), If_CutArrTimeProfile(pIfMan, pCutBest), pFanins, pNtkNew );
        If_ObjSetCopy( pIfObj, pNodeNew );
        return pNodeNew;
    }
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && 
         !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}